

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_MakeGlyphBitmapSubpixel
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int glyph)

{
  int num_verts;
  void *in_stack_ffffffffffffff88;
  int iy0;
  int ix0;
  stbtt_vertex *vertices;
  stbtt__bitmap gbm;
  
  num_verts = stbtt_GetGlyphShape(info,glyph,&vertices);
  stbtt_GetGlyphBitmapBoxSubpixel
            (info,glyph,scale_x,scale_y,shift_x,shift_y,&ix0,&iy0,(int *)0x0,(int *)0x0);
  gbm.w = out_w;
  gbm.h = out_h;
  gbm.stride = out_stride;
  gbm.pixels = output;
  if (out_h != 0 && out_w != 0) {
    stbtt_Rasterize(&gbm,0.35,vertices,num_verts,scale_x,scale_y,shift_x,shift_y,ix0,iy0,1,
                    in_stack_ffffffffffffff88);
  }
  free(vertices);
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixel(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int glyph)
{
   int ix0,iy0;
   stbtt_vertex *vertices;
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);
   stbtt__bitmap gbm;

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,0,0);
   gbm.pixels = output;
   gbm.w = out_w;
   gbm.h = out_h;
   gbm.stride = out_stride;

   if (gbm.w && gbm.h)
      stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0,iy0, 1, info->userdata);

   STBTT_free(vertices, info->userdata);
}